

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O2

int64_t PhPacker::__phpack__detail::php_unpack_impl(char *data,int size,bool issigned,int *map)

{
  ulong uVar1;
  undefined3 in_register_00000011;
  ulong uVar2;
  long local_8;
  
  local_8 = -(ulong)CONCAT31(in_register_00000011,issigned);
  uVar1 = 0;
  uVar2 = (ulong)(uint)size;
  if (size < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    *(char *)((long)&local_8 + (long)map[uVar1]) = data[uVar1];
  }
  return local_8;
}

Assistant:

int64_t php_unpack_impl(const char* data, int size, bool issigned, int* map) noexcept
{
    int64_t result {};
    char* cresult = reinterpret_cast<char*>(&result);

    result = issigned ? -1 : 0;

    for (int i = 0; i < size; ++i) {
        cresult[map[i]] = *data++;
    }
    return result;
}